

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O0

TestCase *
vkt::sr::anon_unknown_0::makeTextureGatherCase
          (TextureType_conflict textureType,TestContext *testCtx,string *name,string *description,
          GatherType gatherType,OffsetSize offsetSize,TextureFormat textureFormat,
          CompareMode shadowCompareMode,WrapMode wrapS,WrapMode wrapT,
          MaybeTextureSwizzle *texSwizzle,FilterMode minFilter,FilterMode magFilter,int baseLevel,
          IVec3 *textureSize,deUint32 flags,ImageBackingMode sparseCase)

{
  OffsetSize offsetSize_00;
  GatherType gatherType_00;
  string *psVar1;
  string *psVar2;
  string *psVar3;
  int textureSize_00;
  TextureGather2DArrayCase *pTVar4;
  undefined1 local_70 [16];
  OffsetSize local_60;
  GatherType local_5c;
  OffsetSize offsetSize_local;
  GatherType gatherType_local;
  string *description_local;
  string *name_local;
  TestContext *testCtx_local;
  TextureGather2DArrayCase *pTStack_38;
  TextureType_conflict textureType_local;
  
  local_60 = offsetSize;
  local_5c = gatherType;
  _offsetSize_local = description;
  description_local = name;
  name_local = (string *)testCtx;
  testCtx_local._4_4_ = textureType;
  if (textureType == TEXTURETYPE_2D) {
    pTVar4 = (TextureGather2DArrayCase *)operator_new(0xc0);
    psVar3 = name_local;
    psVar2 = description_local;
    psVar1 = _offsetSize_local;
    gatherType_00 = local_5c;
    offsetSize_00 = local_60;
    local_70._8_8_ = textureFormat;
    tcu::Vector<int,_3>::swizzle((Vector<int,_3> *)local_70,(int)textureSize,0);
    TextureGather2DCase::TextureGather2DCase
              ((TextureGather2DCase *)pTVar4,(TestContext *)psVar3,psVar2,psVar1,gatherType_00,
               offsetSize_00,(TextureFormat)local_70._8_8_,shadowCompareMode,wrapS,wrapT,texSwizzle,
               minFilter,magFilter,baseLevel,flags,(IVec2 *)local_70,sparseCase);
    pTStack_38 = pTVar4;
  }
  else if (textureType == TEXTURETYPE_2D_ARRAY) {
    pTVar4 = (TextureGather2DArrayCase *)operator_new(200);
    TextureGather2DArrayCase::TextureGather2DArrayCase
              (pTVar4,(TestContext *)name_local,description_local,_offsetSize_local,local_5c,
               local_60,textureFormat,shadowCompareMode,wrapS,wrapT,texSwizzle,minFilter,magFilter,
               baseLevel,flags,textureSize,sparseCase);
    pTStack_38 = pTVar4;
  }
  else if (textureType == TEXTURETYPE_CUBE) {
    pTVar4 = (TextureGather2DArrayCase *)operator_new(0xc0);
    psVar3 = name_local;
    psVar2 = description_local;
    psVar1 = _offsetSize_local;
    textureSize_00 = tcu::Vector<int,_3>::x(textureSize);
    TextureGatherCubeCase::TextureGatherCubeCase
              ((TextureGatherCubeCase *)pTVar4,(TestContext *)psVar3,psVar2,psVar1,textureFormat,
               shadowCompareMode,wrapS,wrapT,texSwizzle,minFilter,magFilter,baseLevel,flags,
               textureSize_00,sparseCase);
    pTStack_38 = pTVar4;
  }
  else {
    pTStack_38 = (TextureGather2DArrayCase *)0x0;
  }
  return &pTStack_38->super_TestCase;
}

Assistant:

static inline TestCase* makeTextureGatherCase (TextureType					textureType,
											   tcu::TestContext&			testCtx,
											   const string&				name,
											   const string&				description,
											   GatherType					gatherType,
											   OffsetSize					offsetSize,
											   tcu::TextureFormat			textureFormat,
											   tcu::Sampler::CompareMode	shadowCompareMode,
											   tcu::Sampler::WrapMode		wrapS,
											   tcu::Sampler::WrapMode		wrapT,
											   const MaybeTextureSwizzle&	texSwizzle,
											   tcu::Sampler::FilterMode		minFilter,
											   tcu::Sampler::FilterMode		magFilter,
											   int							baseLevel,
											   const IVec3&					textureSize,
											   deUint32						flags = 0,
											   const ImageBackingMode		sparseCase = ShaderRenderCaseInstance::IMAGE_BACKING_MODE_REGULAR)
{
	switch (textureType)
	{
		case TEXTURETYPE_2D:
			return new TextureGather2DCase(testCtx, name, description, gatherType, offsetSize, textureFormat, shadowCompareMode,
										   wrapS, wrapT, texSwizzle, minFilter, magFilter, baseLevel, flags, textureSize.swizzle(0, 1), sparseCase);

		case TEXTURETYPE_2D_ARRAY:
			return new TextureGather2DArrayCase(testCtx, name, description, gatherType, offsetSize, textureFormat, shadowCompareMode,
												wrapS, wrapT, texSwizzle, minFilter, magFilter, baseLevel, flags, textureSize, sparseCase);

		case TEXTURETYPE_CUBE:
			DE_ASSERT(gatherType == GATHERTYPE_BASIC);
			DE_ASSERT(offsetSize == OFFSETSIZE_NONE);
			return new TextureGatherCubeCase(testCtx, name, description, textureFormat, shadowCompareMode,
											 wrapS, wrapT, texSwizzle, minFilter, magFilter, baseLevel, flags, textureSize.x(), sparseCase);

		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}